

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.h
# Opt level: O3

bool __thiscall PropertyDef::stdCppSet(PropertyDef *this)

{
  undefined1 *__n;
  int iVar1;
  long in_FS_OFFSET;
  bool bVar2;
  QArrayData *local_50 [3];
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->name).d.size == 0) {
    bVar2 = false;
  }
  else {
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_38,"set",-1);
    QByteArray::append((char)&local_38);
    QByteArray::mid((longlong)local_50,(longlong)this);
    QByteArray::append(&local_38);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],1,0x10);
      }
    }
    __n = (undefined1 *)(this->write).d.size;
    if ((undefined1 *)local_38.d.size == __n) {
      if (__n == (undefined1 *)0x0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_38.d.ptr,(this->write).d.ptr,(size_t)__n);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool stdCppSet() const {
        if (name.isEmpty())
            return false;
        QByteArray s("set");
        s += QtMiscUtils::toAsciiUpper(name[0]);
        s += name.mid(1);
        return (s == write);
    }